

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

void __thiscall
QPixmapIconEngine::addFile
          (QPixmapIconEngine *this,QString *fileName,QSize *size,Mode mode,State state)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  const_iterator o;
  ulong in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar6;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  QPixmapIconEngineEntry *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage *i;
  add_const_t<QList<QImage>_> *__range1;
  int position;
  bool ignoreSize;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QImage> icoImages;
  QImage image;
  QByteArray format;
  QString abs;
  ImageReader imageReader;
  State in_stack_fffffffffffffda8;
  Mode in_stack_fffffffffffffdac;
  QPixmapIconEngineEntry *this_00;
  QPixmapIconEngineEntry *in_stack_fffffffffffffdc0;
  QList<QImage> *in_stack_fffffffffffffdc8;
  QString *file;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  const_iterator local_170;
  QSize local_168;
  QSize local_160;
  QString local_158 [6];
  QSize local_c0;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QFileInfo local_40 [14];
  QChar local_32;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = in_RCX;
  bVar1 = QString::isEmpty((QString *)0x28c0f8);
  if (!bVar1) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RSI;
    QChar::QChar<char16_t,_true>(&local_32,L':');
    uVar4 = QString::startsWith((QChar)(char16_t)this_00,(uint)(ushort)local_32.ucs);
    if ((uVar4 & 1) == 0) {
      QFileInfo::QFileInfo(local_40,(QString *)in_RSI);
      QFileInfo::absoluteFilePath();
      QFileInfo::~QFileInfo(local_40);
    }
    else {
      QString::QString((QString *)this_00,
                       (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    }
    bVar1 = QSize::isValid((QSize *)in_stack_fffffffffffffdc0);
    bVar2 = (bVar1 ^ 0xffU) & 1;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_c75b6::ImageReader::ImageReader
              ((ImageReader *)in_stack_fffffffffffffdc0,(QString *)in_RDI);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_c75b6::ImageReader::format
              ((ImageReader *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    bVar1 = QByteArray::isEmpty((QByteArray *)0x28c258);
    if (!bVar1) {
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)this_00);
      local_78 = "ico";
      bVar1 = ::operator!=((QByteArray *)in_stack_fffffffffffffdc8,
                           (char **)in_stack_fffffffffffffdc0);
      if (bVar1) {
        if (bVar2 == 0) {
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    (in_stack_fffffffffffffdc0,(QString *)in_RDI,(QSize *)this_00,
                     in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
          QList<QPixmapIconEngineEntry>::operator+=
                    ((QList<QPixmapIconEngineEntry> *)this_00,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(this_00);
        }
        else {
          bVar1 = anon_unknown.dwarf_c75b6::ImageReader::supportsReadSize((ImageReader *)0x28c2ea);
          pvVar6 = extraout_RDX;
          if (bVar1) {
            do {
              local_c0 = anon_unknown.dwarf_c75b6::ImageReader::size
                                   ((ImageReader *)
                                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              QPixmapIconEngineEntry::QPixmapIconEngineEntry
                        (in_stack_fffffffffffffdc0,(QString *)in_RDI,(QSize *)this_00,
                         in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
              QList<QPixmapIconEngineEntry>::operator+=
                        ((QList<QPixmapIconEngineEntry> *)this_00,
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              QPixmapIconEngineEntry::~QPixmapIconEngineEntry(this_00);
              bVar1 = anon_unknown.dwarf_c75b6::ImageReader::jumpToNextImage
                                ((ImageReader *)0x28c35d);
            } while (bVar1);
          }
          else {
            while (uVar5 = anon_unknown.dwarf_c75b6::ImageReader::read
                                     ((ImageReader *)local_18,(int)&local_70,pvVar6,uVar5),
                  (uVar5 & 1) != 0) {
              uVar5 = in_RCX & 0xffffffff;
              QPixmapIconEngineEntry::QPixmapIconEngineEntry
                        ((QPixmapIconEngineEntry *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (QString *)in_stack_fffffffffffffdc8,(QImage *)in_stack_fffffffffffffdc0,
                         (Mode)((ulong)in_RDI >> 0x20),(State)in_RDI);
              QList<QPixmapIconEngineEntry>::operator+=
                        ((QList<QPixmapIconEngineEntry> *)this_00,
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              QPixmapIconEngineEntry::~QPixmapIconEngineEntry(this_00);
              pvVar6 = extraout_RDX_00;
            }
          }
        }
      }
      else {
        local_158[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_158[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QList<QImage>::QList((QList<QImage> *)0x28c45c);
        pvVar6 = extraout_RDX_01;
        while (uVar4 = anon_unknown.dwarf_c75b6::ImageReader::read
                                 ((ImageReader *)local_18,(int)&local_70,pvVar6,uVar5),
              (uVar4 & 1) != 0) {
          in_stack_fffffffffffffdac = CONCAT13(1,(int3)in_stack_fffffffffffffdac);
          pvVar6 = extraout_RDX_02;
          if (bVar2 == 0) {
            local_160 = QImage::size((QImage *)this_00);
            bVar1 = ::operator==((QSize *)this_00,
                                 (QSize *)CONCAT44(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8));
            in_stack_fffffffffffffdac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
            pvVar6 = extraout_RDX_03;
          }
          if ((char)(in_stack_fffffffffffffdac >> 0x18) != '\0') {
            local_168 = QImage::size((QImage *)this_00);
            in_stack_fffffffffffffdd4 =
                 findBySize(in_stack_fffffffffffffdc8,(QSize *)in_stack_fffffffffffffdc0);
            if (in_stack_fffffffffffffdd4 < 0) {
              QList<QImage>::append
                        ((QList<QImage> *)this_00,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              pvVar6 = extraout_RDX_06;
            }
            else {
              in_stack_fffffffffffffda8 = origIcoDepth(in_RDI);
              QList<QImage>::at((QList<QImage> *)this_00,
                                CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              uVar3 = origIcoDepth(in_RDI);
              uVar5 = (ulong)uVar3;
              pvVar6 = extraout_RDX_04;
              if ((int)uVar3 < (int)in_stack_fffffffffffffda8) {
                QList<QImage>::operator[]
                          ((QList<QImage> *)this_00,
                           CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
                QImage::operator=((QImage *)in_stack_fffffffffffffdc0,in_RDI);
                pvVar6 = extraout_RDX_05;
              }
            }
          }
        }
        file = local_158;
        local_170.i = (QImage *)&DAT_aaaaaaaaaaaaaaaa;
        local_170 = QList<QImage>::begin((QList<QImage> *)this_00);
        o = QList<QImage>::end((QList<QImage> *)this_00);
        while (bVar1 = QList<QImage>::const_iterator::operator!=(&local_170,o), bVar1) {
          in_stack_fffffffffffffdc0 =
               (QPixmapIconEngineEntry *)QList<QImage>::const_iterator::operator*(&local_170);
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    ((QPixmapIconEngineEntry *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),file,
                     (QImage *)in_stack_fffffffffffffdc0,(Mode)((ulong)in_RDI >> 0x20),(State)in_RDI
                    );
          QList<QPixmapIconEngineEntry>::operator+=
                    ((QList<QPixmapIconEngineEntry> *)this_00,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(this_00);
          QList<QImage>::const_iterator::operator++(&local_170);
        }
        bVar1 = QList<QImage>::isEmpty((QList<QImage> *)0x28c676);
        if ((bVar1) && (bVar2 == 0)) {
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    (in_stack_fffffffffffffdc0,(QString *)in_RDI,(QSize *)this_00,
                     in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
          QList<QPixmapIconEngineEntry>::operator+=
                    ((QList<QPixmapIconEngineEntry> *)this_00,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(this_00);
        }
        QList<QImage>::~QList((QList<QImage> *)0x28c6cd);
      }
      QImage::~QImage((QImage *)this_00);
    }
    QByteArray::~QByteArray((QByteArray *)0x28c6ef);
    anon_unknown.dwarf_c75b6::ImageReader::~ImageReader((ImageReader *)0x28c6fc);
    QString::~QString((QString *)0x28c709);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapIconEngine::addFile(const QString &fileName, const QSize &size, QIcon::Mode mode, QIcon::State state)
{
    if (fileName.isEmpty())
        return;
    const QString abs = fileName.startsWith(u':') ? fileName : QFileInfo(fileName).absoluteFilePath();
    const bool ignoreSize = !size.isValid();
    ImageReader imageReader(abs);
    const QByteArray format = imageReader.format();
    if (format.isEmpty()) // Device failed to open or unsupported format.
        return;
    QImage image;
    if (format != "ico") {
        if (ignoreSize) { // No size specified: Add all images.
            if (imageReader.supportsReadSize()) {
                do {
                    pixmaps += QPixmapIconEngineEntry(abs, imageReader.size(), mode, state);
                } while (imageReader.jumpToNextImage());
            } else {
                while (imageReader.read(&image))
                    pixmaps += QPixmapIconEngineEntry(abs, image, mode, state);
            }
        } else {
            pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
        }
        return;
    }
    // Special case for reading Windows ".ico" files. Historically (QTBUG-39287),
    // these files may contain low-resolution images. As this information is lost,
    // ICOReader sets the original format as an image text key value. Read all matching
    // images into a list trying to find the highest quality per size.
    QList<QImage> icoImages;
    while (imageReader.read(&image)) {
        if (ignoreSize || image.size() == size) {
            const int position = findBySize(icoImages, image.size());
            if (position >= 0) { // Higher quality available? -> replace.
                if (origIcoDepth(image) > origIcoDepth(icoImages.at(position)))
                    icoImages[position] = image;
            } else {
                icoImages.append(image);
            }
        }
    }
    for (const QImage &i : std::as_const(icoImages))
        pixmaps += QPixmapIconEngineEntry(abs, i, mode, state);
    if (icoImages.isEmpty() && !ignoreSize) // Add placeholder with the filename and empty pixmap for the size.
        pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
}